

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::ScanLineInputFile::~ScanLineInputFile(ScanLineInputFile *this)

{
  _func_int **pp_Var1;
  Data *pDVar2;
  GenericInputFile *in_RDI;
  size_t i;
  Data *in_stack_ffffffffffffffe0;
  Data *local_10;
  
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__ScanLineInputFile_005625e8;
  if ((*(byte *)((long)in_RDI[1]._vptr_GenericInputFile + 0x144) & 1) == 0) {
    local_10 = (Data *)0x0;
    while (in_stack_ffffffffffffffe0 = local_10,
          pDVar2 = (Data *)std::
                           vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                           ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                   *)(in_RDI[1]._vptr_GenericInputFile + 0x23)),
          in_stack_ffffffffffffffe0 < pDVar2) {
      std::
      vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                    *)(in_RDI[1]._vptr_GenericInputFile + 0x23),(size_type)local_10);
      EXRFreeAligned((void *)0x294099);
      local_10 = (Data *)((long)&(local_10->super_Mutex).super___mutex_base._M_mutex + 1);
    }
  }
  if ((*(int *)(in_RDI[1]._vptr_GenericInputFile + 0x28) == -1) &&
     (in_RDI[2]._vptr_GenericInputFile != (_func_int **)0x0)) {
    operator_delete(in_RDI[2]._vptr_GenericInputFile,0x38);
  }
  pp_Var1 = in_RDI[1]._vptr_GenericInputFile;
  if (pp_Var1 != (_func_int **)0x0) {
    Data::~Data(in_stack_ffffffffffffffe0);
    operator_delete(pp_Var1,0x168);
  }
  GenericInputFile::~GenericInputFile(in_RDI);
  return;
}

Assistant:

ScanLineInputFile::~ScanLineInputFile ()
{
    if (!_data->memoryMapped)
    {
        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        {
            EXRFreeAligned(_data->lineBuffers[i]->buffer);
        }
    }
            

    //
    // ScanLineInputFile should never delete the stream,
    // because it does not own the stream.
    // We just delete the Mutex here.
    //
    if (_data->partNumber == -1)
        delete _streamData;

    delete _data;
}